

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O2

void advance(ParserState *ps)

{
  size_t sVar1;
  Token TVar2;
  char *err;
  char *local_10;
  
  local_10 = (char *)0x0;
  sVar1 = (ps->toktext).len;
  (ps->lasttoktext).ptr = (ps->toktext).ptr;
  (ps->lasttoktext).len = sVar1;
  TVar2 = lex(&ps->currtext,&ps->toktext,&local_10);
  ps->tok = TVar2;
  if (TVar2 == TOK_ERROR) {
    error(ps,local_10,ps->toktext);
    return;
  }
  return;
}

Assistant:

static void advance(ParserState *ps)
{
    char *err = NULL;
    ps->lasttoktext = ps->toktext;
    ps->tok = lex(&ps->currtext, &ps->toktext, &err);
    if (ps->tok == TOK_ERROR)
        error(ps, err, ps->toktext);
}